

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_moveOperandToRegister
               (sysbvm_bytecodeJit_t *jit,sysbvm_x86_register_t reg,int16_t operand)

{
  int offset;
  int32_t vectorOffset;
  int16_t vectorIndex;
  sysbvm_operandVectorName_t vectorType;
  int16_t operand_local;
  sysbvm_x86_register_t reg_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  if (operand >> 2 < 0) {
    sysbvm_jit_x86_xorRegister(jit,reg,reg);
  }
  else {
    offset = (operand >> 2) * 8;
    switch(operand & 3) {
    case 0:
      sysbvm_jit_x86_mov64FromMemoryWithOffset(jit,reg,SYSBVM_X86_EBP,jit->argumentVectorOffset);
      sysbvm_jit_x86_mov64FromMemoryWithOffset(jit,reg,reg,offset);
      break;
    case 1:
      sysbvm_jit_x86_mov64FromMemoryWithOffset(jit,reg,SYSBVM_X86_EBP,jit->captureVectorOffset);
      sysbvm_jit_x86_mov64FromMemoryWithOffset(jit,reg,reg,offset + 0x10);
      break;
    case 2:
      sysbvm_jit_x86_mov64FromMemoryWithOffset(jit,reg,SYSBVM_X86_EBP,jit->literalVectorOffset);
      sysbvm_jit_x86_mov64FromMemoryWithOffset(jit,reg,reg,offset + 0x10);
      break;
    case 3:
      sysbvm_jit_x86_mov64FromMemoryWithOffset
                (jit,reg,SYSBVM_X86_EBP,jit->localVectorOffset + offset);
    }
  }
  return;
}

Assistant:

static void sysbvm_jit_moveOperandToRegister(sysbvm_bytecodeJit_t *jit, sysbvm_x86_register_t reg, int16_t operand)
{
    sysbvm_operandVectorName_t vectorType = (sysbvm_operandVectorName_t) (operand & SYSBVM_OPERAND_VECTOR_BITMASK);
    int16_t vectorIndex = operand >> SYSBVM_OPERAND_VECTOR_BITS;
    if(vectorIndex < 0)
    {
        sysbvm_jit_x86_xorRegister(jit, reg, reg);
        return;
    }

    int32_t vectorOffset = (int32_t)vectorIndex * sizeof(void*);
    switch(vectorType)
    {
    case SYSBVM_OPERAND_VECTOR_ARGUMENTS:
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, reg, SYSBVM_X86_RBP, jit->argumentVectorOffset);
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, reg, reg, vectorOffset);
        break;
    case SYSBVM_OPERAND_VECTOR_CAPTURES:
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, reg, SYSBVM_X86_RBP, jit->captureVectorOffset);
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, reg, reg, sizeof(sysbvm_tuple_header_t) + vectorOffset);
        break;
    case SYSBVM_OPERAND_VECTOR_LITERAL:
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, reg, SYSBVM_X86_RBP, jit->literalVectorOffset);
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, reg, reg, sizeof(sysbvm_tuple_header_t) + vectorOffset);
        break;
    case SYSBVM_OPERAND_VECTOR_LOCAL:
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, reg, SYSBVM_X86_RBP, jit->localVectorOffset + vectorOffset);
        break;
    }
}